

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O1

size_t prt_terrain(wchar_t row,wchar_t col)

{
  uint8_t attr;
  ushort uVar1;
  loc grid;
  loc grid_00;
  loc grid_01;
  trap_kind_conflict *ptVar2;
  _Bool _Var3;
  feature *pfVar4;
  trap *ptVar5;
  char *str;
  size_t sVar6;
  ulong uVar7;
  uint8_t *puVar8;
  long lVar9;
  char buf [30];
  char acStack_58 [40];
  
  grid.x = (player->grid).x;
  grid.y = (player->grid).y;
  pfVar4 = square_feat(cave,grid);
  grid_00.x = (player->grid).x;
  grid_00.y = (player->grid).y;
  ptVar5 = square_trap(cave,grid_00);
  if (ptVar5 != (trap *)0x0) {
    grid_01.x = (player->grid).x;
    grid_01.y = (player->grid).y;
    _Var3 = square_isinvis(cave,grid_01);
    if (!_Var3) {
      my_strcpy(acStack_58,ptVar5->kind->name,0x1e);
      puVar8 = &ptVar5->kind->d_attr;
      goto LAB_001c3cfd;
    }
  }
  my_strcpy(acStack_58,pfVar4->name,0x1e);
  puVar8 = &pfVar4->d_attr;
LAB_001c3cfd:
  attr = *puVar8;
  my_strcap(acStack_58);
  uVar7 = 0;
  str = format("%s ",acStack_58);
  c_put_str(attr,str,row,col);
  ptVar2 = trap_info;
  uVar1 = z_info->trap_max;
  if (uVar1 != 0) {
    lVar9 = 0;
    uVar7 = 0;
    do {
      sVar6 = strlen(*(char **)(ptVar2->flags + lVar9 + -0x68));
      if (uVar7 < sVar6) {
        uVar7 = sVar6;
      }
      lVar9 = lVar9 + 0x80;
    } while ((ulong)uVar1 * 0x80 != lVar9);
  }
  pfVar4 = f_info;
  lVar9 = 0;
  do {
    sVar6 = strlen(*(char **)(pfVar4->flags + lVar9 + -0x23));
    if (uVar7 < sVar6) {
      uVar7 = sVar6;
    }
    lVar9 = lVar9 + 0x70;
  } while (lVar9 != 0xaf0);
  return (long)((int)uVar7 + 1);
}

Assistant:

static size_t prt_terrain(int row, int col)
{
	struct feature *feat = square_feat(cave, player->grid);
	struct trap *trap = square_trap(cave, player->grid);
	char buf[30];
	uint8_t attr;

	if (trap && !square_isinvis(cave, player->grid)) {
		my_strcpy(buf, trap->kind->name, sizeof(buf));
		attr = trap->kind->d_attr;
	} else {
		my_strcpy(buf, feat->name, sizeof(buf));
		attr = feat->d_attr;
	}
	my_strcap(buf);
	c_put_str(attr, format("%s ", buf), row, col);

	return longest_terrain_name() + 1;
}